

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O3

bool __thiscall OpenMD::Globals::addFragmentStamp(Globals *this,FragmentStamp *fragStamp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  iterator iVar3;
  ostream *poVar4;
  OpenMDException *this_00;
  string fragStampName;
  ostringstream oss;
  string local_1e8;
  key_type local_1c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>
  local_1a8 [9];
  
  pcVar2 = (fragStamp->Name).data_._M_dataplus._M_p;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar2,pcVar2 + (fragStamp->Name).data_._M_string_length);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>_>
          ::find(&(this->fragmentStamps_)._M_t,&local_1c8);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->fragmentStamps_)._M_t._M_impl.super__Rb_tree_header) {
    paVar1 = &local_1a8[0].first.field_2;
    local_1a8[0].first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_1c8._M_dataplus._M_p,
               local_1c8._M_dataplus._M_p + local_1c8._M_string_length);
    local_1a8[0].second = fragStamp;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::FragmentStamp*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::FragmentStamp*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::FragmentStamp*>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::FragmentStamp*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::FragmentStamp*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::FragmentStamp*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::FragmentStamp*>>>
                *)&this->fragmentStamps_,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0].first._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8[0].first._M_dataplus._M_p,
                      local_1a8[0].first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Globals Error: Fragment Stamp ",0x1e);
  pcVar2 = (fragStamp->Name).data_._M_dataplus._M_p;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar2,pcVar2 + (fragStamp->Name).data_._M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"appears multiple times\n",0x17);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(this_00,&local_1e8);
  __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

bool Globals::addFragmentStamp(FragmentStamp* fragStamp) {
    std::string fragStampName = fragStamp->getName();
    std::map<std::string, FragmentStamp*>::iterator i;
    bool ret = false;
    i        = fragmentStamps_.find(fragStampName);
    if (i == fragmentStamps_.end()) {
      fragmentStamps_.insert(std::map<std::string, FragmentStamp*>::value_type(
          fragStampName, fragStamp));
      ret = true;
    } else {
      std::ostringstream oss;
      oss << "Globals Error: Fragment Stamp " << fragStamp->getName()
          << "appears multiple times\n";
      throw OpenMDException(oss.str());
    }
    return ret;
  }